

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

uint64_t load_helper(CPUArchState_conflict30 *env,target_ulong_conflict addr,TCGMemOpIdx oi,
                    uintptr_t retaddr,MemOp op,_Bool code_read,FullLoadHelper_conflict14 *full_load)

{
  int iVar1;
  uc_struct *puVar2;
  void *pvVar3;
  long lVar4;
  char cVar5;
  _Bool _Var6;
  byte bVar7;
  uint uVar8;
  uint *puVar9;
  MemoryRegion *pMVar10;
  uint64_t uVar11;
  uint64_t uVar12;
  byte bVar13;
  MemOp MVar14;
  uint uVar15;
  list_item *plVar16;
  uint uVar17;
  CPUTriCoreState *__mptr_4;
  uint uVar18;
  int iVar19;
  MMUAccessType access_type;
  undefined7 in_register_00000089;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  CPUIOTLBEntry *iotlbentry;
  CPUTriCoreState *__mptr;
  ulong uVar23;
  ulong uVar24;
  MemOp op_00;
  uintptr_t in_stack_ffffffffffffff48;
  uintptr_t uVar25;
  uint local_9c;
  ulong local_98;
  uint *local_90;
  ulong local_78;
  ulong len;
  
  uVar24 = (ulong)(oi & 0xf);
  uVar23 = (ulong)((oi & 0xf) << 4);
  uVar8 = addr >> 0xe;
  uVar18 = *(uint *)((long)env->gpr_a + (uVar23 - 0x40)) >> 6 & uVar8;
  local_78 = (ulong)uVar18;
  local_90 = (uint *)((ulong)(uVar18 << 6) + *(long *)((long)env->gpr_a + (uVar23 - 0x38)));
  iVar1 = (int)CONCAT71(in_register_00000089,code_read);
  uVar22 = (ulong)(uint)(iVar1 * 8);
  uVar18 = oi >> 4 & 0x70;
  if (uVar18 != 0) {
    if (uVar18 == 0x70) {
      uVar18 = oi >> 4 & 3;
    }
    else {
      uVar18 = uVar18 >> 4;
    }
  }
  iVar1 = iVar1 * 2;
  MVar14 = op & MO_64;
  uVar17 = 1 << (sbyte)MVar14;
  len = (ulong)uVar17;
  local_9c = *(uint *)(uVar22 + (long)local_90);
  puVar2 = (uc_struct *)env->uc;
  if ((~(-1 << ((byte)uVar18 & 0x1f)) & addr) != 0) {
    (**(code **)(*(long *)&env[-4].end_reset_fields + 0x18))
              (&env[-0x32].cpu_model,addr,iVar1,uVar24,retaddr);
  }
  puVar9 = (uint *)((long)env->gpr_a + (uVar23 - 0x40));
  uVar18 = addr & 0xffffc000;
  if ((local_9c & 0xffffe000) != uVar18) {
    _Var6 = victim_tlb_hit(env,uVar24,local_78,uVar22,uVar18);
    if (!_Var6) {
      in_stack_ffffffffffffff48 = retaddr;
      cVar5 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,addr,len,iVar1,uVar24,0);
      if (cVar5 == '\0') goto LAB_00d127c0;
      uVar21 = uVar8 & *puVar9 >> 6;
      local_78 = (ulong)uVar21;
      local_90 = (uint *)((ulong)(uVar21 << 6) + *(long *)((long)env->gpr_a + (uVar23 - 0x38)));
    }
    local_9c = *(uint *)((long)local_90 + uVar22) & 0xffffdfff;
  }
  uVar21 = addr & 0x3fff;
  local_98 = (ulong)(local_90[3] | uVar21);
  pMVar10 = (*puVar2->memory_mapping)(puVar2,local_98);
  if (pMVar10 == (MemoryRegion *)0x0) {
    iVar19 = puVar2->invalid_error;
    if (iVar19 == 0) {
      if (code_read) {
        for (plVar16 = puVar2->hook[6].head;
            (iVar19 = 8, plVar16 != (list_item *)0x0 &&
            (pvVar3 = plVar16->data, pvVar3 != (void *)0x0)); plVar16 = plVar16->next) {
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
              local_98 <= *(ulong *)((long)pvVar3 + 0x20) &&
              *(ulong *)((long)pvVar3 + 0x18) <= local_98)) {
            cVar5 = (**(code **)((long)pvVar3 + 0x28))
                              (puVar2,0x15,local_98,len,0,*(undefined8 *)((long)pvVar3 + 0x30));
            if (cVar5 != '\0') goto LAB_00d124df;
            iVar19 = 8;
            if (puVar2->stop_request != false) break;
          }
        }
      }
      else {
        for (plVar16 = puVar2->hook[4].head;
            (iVar19 = 6, plVar16 != (list_item *)0x0 &&
            (pvVar3 = plVar16->data, pvVar3 != (void *)0x0)); plVar16 = plVar16->next) {
          if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
             (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
              local_98 <= *(ulong *)((long)pvVar3 + 0x20) &&
              *(ulong *)((long)pvVar3 + 0x18) <= local_98)) {
            cVar5 = (**(code **)((long)pvVar3 + 0x28))
                              (puVar2,0x13,local_98,len,0,*(undefined8 *)((long)pvVar3 + 0x30));
            if (cVar5 != '\0') goto LAB_00d124df;
            iVar19 = 6;
            if (puVar2->stop_request != false) break;
          }
        }
      }
    }
    puVar2->invalid_addr = local_98;
    puVar2->invalid_error = iVar19;
    goto LAB_00d123a4;
  }
LAB_00d11fd9:
  op_00 = (MemOp)in_stack_ffffffffffffff48;
  if (code_read) {
    if ((pMVar10->perms & 4) == 0) {
      for (plVar16 = puVar2->hook[9].head;
          (plVar16 != (list_item *)0x0 && (pvVar3 = plVar16->data, pvVar3 != (void *)0x0));
          plVar16 = plVar16->next) {
        if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
           (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
            local_98 <= *(ulong *)((long)pvVar3 + 0x20) &&
            *(ulong *)((long)pvVar3 + 0x18) <= local_98)) {
          cVar5 = (**(code **)((long)pvVar3 + 0x28))
                            (puVar2,0x18,local_98,len,0,*(undefined8 *)((long)pvVar3 + 0x30));
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          if (cVar5 != '\0') {
            puVar2->invalid_error = 0;
            goto LAB_00d1228a;
          }
          if (puVar2->stop_request != false) break;
        }
      }
      puVar2->invalid_addr = local_98;
      puVar2->invalid_error = 0xe;
LAB_00d123a4:
      if ((0 < puVar2->nested_level) && (puVar2->cpu->stopped == false)) {
        cpu_exit(puVar2->cpu);
        cpu_loop_exit_tricore((CPUState_conflict *)puVar2->cpu);
      }
      return 0;
    }
  }
  else {
    plVar16 = puVar2->hook[10].head;
    while (((plVar16 != (list_item *)0x0 && (pvVar3 = plVar16->data, pvVar3 != (void *)0x0)) &&
           ((*(char *)((long)pvVar3 + 0x14) != '\0' ||
            ((*(ulong *)((long)pvVar3 + 0x18) <= *(ulong *)((long)pvVar3 + 0x20) &&
              (*(ulong *)((long)pvVar3 + 0x20) < local_98 ||
              local_98 < *(ulong *)((long)pvVar3 + 0x18)) ||
             ((**(code **)((long)pvVar3 + 0x28))
                        (env->uc,0x10,local_98,len,0,*(undefined8 *)((long)pvVar3 + 0x30)),
             puVar2->stop_request == false))))))) {
      plVar16 = plVar16->next;
    }
    op_00 = (MemOp)in_stack_ffffffffffffff48;
    if ((pMVar10->perms & 1) == 0) {
      for (plVar16 = puVar2->hook[7].head;
          (plVar16 != (list_item *)0x0 && (pvVar3 = plVar16->data, pvVar3 != (void *)0x0));
          plVar16 = plVar16->next) {
        if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
           (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
            local_98 <= *(ulong *)((long)pvVar3 + 0x20) &&
            *(ulong *)((long)pvVar3 + 0x18) <= local_98)) {
          cVar5 = (**(code **)((long)pvVar3 + 0x28))
                            (puVar2,0x17,local_98,len,0,*(undefined8 *)((long)pvVar3 + 0x30));
          op_00 = (MemOp)in_stack_ffffffffffffff48;
          if (cVar5 != '\0') {
            puVar2->invalid_error = 0;
            uVar20 = (ulong)local_9c;
            if ((local_9c & 0xffffe000) == uVar18) goto LAB_00d1228f;
            _Var6 = victim_tlb_hit(env,uVar24,local_78,uVar22,uVar18);
            if (!_Var6) {
              uVar25 = retaddr;
              cVar5 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                                (&env[-0x32].cpu_model,addr,uVar17,iVar1,uVar24,0);
              op_00 = (MemOp)uVar25;
              if (cVar5 == '\0') goto LAB_00d127c0;
              uVar8 = uVar8 & *puVar9 >> 6;
              local_78 = (ulong)uVar8;
              local_90 = (uint *)((ulong)(uVar8 << 6) +
                                 *(long *)((long)env->gpr_a + (uVar23 - 0x38)));
            }
            uVar20 = (ulong)(*local_90 & 0xffffdfff);
            goto LAB_00d1228f;
          }
          if (puVar2->stop_request != false) break;
        }
      }
      puVar2->invalid_addr = local_98;
      puVar2->invalid_error = 0xd;
      goto LAB_00d123a4;
    }
  }
LAB_00d1228a:
  uVar20 = (ulong)local_9c;
LAB_00d1228f:
  access_type = (MMUAccessType)uVar20;
  if ((uVar20 & 0x3fff) == 0) {
    if ((MVar14 == MO_8) || (0xffffffffffffbfff < (ulong)(uVar21 + uVar17) - 0x4001)) {
      uVar11 = 0;
      if (op < (MO_BE|MO_ASHIFT)) {
        uVar22 = (ulong)addr;
        lVar4 = *(long *)(local_90 + 4);
        switch(op) {
        case MO_8:
          uVar11 = (uint64_t)*(byte *)(lVar4 + uVar22);
          break;
        case MO_16:
          uVar11 = (uint64_t)*(ushort *)(lVar4 + uVar22);
          break;
        case MO_32:
          uVar11 = (uint64_t)*(uint *)(lVar4 + uVar22);
          break;
        case MO_64:
          uVar11 = *(uint64_t *)(lVar4 + uVar22);
          break;
        case MO_BEUW:
          uVar11 = (uint64_t)
                   (ushort)(*(ushort *)(lVar4 + uVar22) << 8 | *(ushort *)(lVar4 + uVar22) >> 8);
          break;
        case MO_BEUL:
          uVar8 = *(uint *)(lVar4 + uVar22);
          uVar11 = (uint64_t)
                   (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18)
          ;
          break;
        case MO_BEQ:
          uVar22 = *(ulong *)(lVar4 + uVar22);
          uVar11 = uVar22 >> 0x38 | (uVar22 & 0xff000000000000) >> 0x28 |
                   (uVar22 & 0xff0000000000) >> 0x18 | (uVar22 & 0xff00000000) >> 8 |
                   (uVar22 & 0xff000000) << 8 | (uVar22 & 0xff0000) << 0x18 |
                   (uVar22 & 0xff00) << 0x28 | uVar22 << 0x38;
        }
      }
      goto switchD_00d122df_caseD_4;
    }
  }
  else if ((uVar17 - 1 & addr) == 0) {
    iotlbentry = (CPUIOTLBEntry *)
                 (*(long *)((long)env + uVar24 * 0x2b0 + -0x5a8) + (ulong)(uint)((int)local_78 << 4)
                 );
    if ((access_type >> 10 & 1) != 0) {
      cpu_check_watchpoint_tricore
                ((CPUState *)&env[-0x32].cpu_model,(ulong)addr,len,iotlbentry->attrs,1,retaddr);
    }
    bVar7 = (byte)(uVar20 >> 9) & 1 & MVar14 != MO_8;
    if ((access_type >> 0xb & 1) == 0) {
      if (bVar7 != 0) {
        op = op ^ MO_BE;
      }
      uVar11 = load_memop((void *)((ulong)addr + *(long *)(local_90 + 4)),op);
    }
    else {
      uVar11 = io_readx(env,iotlbentry,addr,(target_ulong_conflict)retaddr,
                        (ulong)((uint)bVar7 << 3 ^ op),access_type,op_00);
    }
    goto switchD_00d122df_caseD_4;
  }
  iVar1 = puVar2->size_recur_mem;
  puVar2->size_recur_mem = uVar17;
  uVar11 = (*full_load)(env,-uVar17 & addr,oi,retaddr);
  uVar12 = (*full_load)(env,(-uVar17 & addr) + uVar17,oi,retaddr);
  puVar2->size_recur_mem = iVar1;
  cVar5 = (char)uVar17;
  bVar7 = cVar5 - 1U & (byte)addr;
  bVar13 = bVar7 * '\b';
  bVar7 = cVar5 * '\b' + bVar7 * -8;
  if ((op & MO_BE) == MO_8) {
    uVar24 = uVar11 >> (bVar13 & 0x3f);
    uVar22 = uVar12 << (bVar7 & 0x3f);
  }
  else {
    uVar24 = uVar11 << (bVar13 & 0x3f);
    uVar22 = uVar12 >> (bVar7 & 0x3f);
  }
  uVar11 = ((uVar22 | uVar24) << (cVar5 * -8 & 0x3fU)) >> (cVar5 * -8 & 0x3fU);
switchD_00d122df_caseD_4:
  if (code_read) {
    return uVar11;
  }
  if (puVar2->size_recur_mem != 0) {
    return uVar11;
  }
  plVar16 = puVar2->hook[0xd].head;
  if (plVar16 == (list_item *)0x0) {
    return uVar11;
  }
  while( true ) {
    pvVar3 = plVar16->data;
    if (pvVar3 == (void *)0x0) {
      return uVar11;
    }
    if (((*(char *)((long)pvVar3 + 0x14) == '\0') &&
        (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18) ||
         local_98 <= *(ulong *)((long)pvVar3 + 0x20) && *(ulong *)((long)pvVar3 + 0x18) <= local_98)
        ) && ((**(code **)((long)pvVar3 + 0x28))
                        (env->uc,0x19,local_98,len,uVar11,*(undefined8 *)((long)pvVar3 + 0x30)),
             puVar2->stop_request != false)) break;
    plVar16 = plVar16->next;
    if (plVar16 == (list_item *)0x0) {
      return uVar11;
    }
  }
  return uVar11;
LAB_00d124df:
  puVar2->invalid_error = 0;
  if ((local_9c & 0xffffe000) != uVar18) {
    _Var6 = victim_tlb_hit(env,uVar24,local_78,uVar22,uVar18);
    if (!_Var6) {
      in_stack_ffffffffffffff48 = retaddr;
      cVar5 = (**(code **)(*(long *)&env[-4].end_reset_fields + 0x48))
                        (&env[-0x32].cpu_model,addr,len,iVar1,uVar24,0);
      if (cVar5 == '\0') {
LAB_00d127c0:
        __assert_fail("ok",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                      ,0x3c7,
                      "void tlb_fill(CPUState *, target_ulong, int, MMUAccessType, int, uintptr_t)")
        ;
      }
      uVar15 = uVar8 & *puVar9 >> 6;
      local_78 = (ulong)uVar15;
      local_90 = (uint *)((ulong)(uVar15 << 6) + *(long *)((long)env->gpr_a + (uVar23 - 0x38)));
    }
    local_9c = *(uint *)((long)local_90 + uVar22) & 0xffffdfff;
  }
  local_98 = (ulong)(local_90[3] | uVar21);
  pMVar10 = (*puVar2->memory_mapping)(puVar2,local_98);
  if (pMVar10 == (MemoryRegion *)0x0) {
    puVar2->invalid_error = 0xb;
    goto LAB_00d123a4;
  }
  goto LAB_00d11fd9;
}

Assistant:

static uint64_t inline
load_helper(CPUArchState *env, target_ulong addr, TCGMemOpIdx oi,
            uintptr_t retaddr, MemOp op, bool code_read,
            FullLoadHelper *full_load)
{
    uintptr_t mmu_idx = get_mmuidx(oi);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    target_ulong tlb_addr = code_read ? entry->addr_code : entry->addr_read;
    target_ulong paddr;
    const size_t tlb_off = code_read ?
        offsetof(CPUTLBEntry, addr_code) : offsetof(CPUTLBEntry, addr_read);
    const MMUAccessType access_type =
        code_read ? MMU_INST_FETCH : MMU_DATA_LOAD;
    unsigned a_bits = get_alignment_bits(get_memop(oi));
    void *haddr;
    uint64_t res;
    size_t size = memop_size(op);
    int error_code;
    struct hook *hook;
    bool handled;
    HOOK_FOREACH_VAR_DECLARE;
    struct uc_struct *uc = env->uc;
    MemoryRegion *mr;

    /* Handle CPU specific unaligned behaviour */
    if (addr & ((1 << a_bits) - 1)) {
        cpu_unaligned_access(env_cpu(env), addr, access_type,
                             mmu_idx, retaddr);
    }

    /* If the TLB entry is for a different page, reload and try again.  */
    if (!tlb_hit(env->uc, tlb_addr, addr)) {
        if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                            addr & TARGET_PAGE_MASK)) {
            tlb_fill(env_cpu(env), addr, size,
                     access_type, mmu_idx, retaddr);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);
        }
        tlb_addr = code_read ? entry->addr_code : entry->addr_read;
        tlb_addr &= ~TLB_INVALID_MASK;
    }

    paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
    mr = uc->memory_mapping(uc, paddr);

    // memory might be still unmapped while reading or fetching
    if (mr == NULL) {
        handled = false;
        // if there is already an unhandled eror, skip callbacks.
        if (uc->invalid_error == UC_ERR_OK) {
            if (code_read) {
                // code fetching
                error_code = UC_ERR_FETCH_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            } else {
                // data reading
                error_code = UC_ERR_READ_UNMAPPED;
                HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_UNMAPPED) {
                    if (hook->to_delete)
                        continue;
                    if (!HOOK_BOUND_CHECK(hook, paddr))
                        continue;
                    if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_UNMAPPED, paddr, size, 0, hook->user_data)))
                        break;

                    // the last callback may already asked to stop emulation
                    if (uc->stop_request)
                        break;
                }
            }
        } else {
            error_code = uc->invalid_error;
        }

        if (handled) {
            uc->invalid_error = UC_ERR_OK;
            /* If the TLB entry is for a different page, reload and try again.  */
            if (!tlb_hit(env->uc, tlb_addr, addr)) {
                if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                    addr & TARGET_PAGE_MASK)) {
                    tlb_fill(env_cpu(env), addr, size,
                             access_type, mmu_idx, retaddr);
                    index = tlb_index(env, mmu_idx, addr);
                    entry = tlb_entry(env, mmu_idx, addr);
                }
                tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                tlb_addr &= ~TLB_INVALID_MASK;
            }
            paddr = entry->paddr | (addr & ~TARGET_PAGE_MASK);
            mr = uc->memory_mapping(uc, paddr);
            if (mr == NULL) {
                uc->invalid_error = UC_ERR_MAP;
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // XXX(@lazymio): We have to exit early so that the target register won't be overwritten
                    //                because qemu might generate tcg code like:
                    //                       qemu_ld_i64 x0,x1,leq,8  sync: 0  dead: 0 1
                    //                where we don't have a change to recover x0 value
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        } else {
            uc->invalid_addr = paddr;
            uc->invalid_error = error_code;
            // printf("***** Invalid fetch (unmapped memory) at " TARGET_FMT_lx "\n", addr);
            if (uc->nested_level > 0 && !uc->cpu->stopped) {
                cpu_exit(uc->cpu);
                // See comments above
                cpu_loop_exit(uc->cpu);
            }
            return 0;
        }
    }

    // now it is read on mapped memory
    if (!code_read) {
        // this is date reading
        HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ) {
            if (hook->to_delete)
                continue;
            if (!HOOK_BOUND_CHECK(hook, paddr))
                continue;
            ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ, paddr, size, 0, hook->user_data);

            // the last callback may already asked to stop emulation
            if (uc->stop_request)
                break;
        }

        // callback on non-readable memory
        if (mr != NULL && !(mr->perms & UC_PROT_READ)) {  //non-readable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_READ_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
                /* If the TLB entry is for a different page, reload and try again.  */
                if (!tlb_hit(env->uc, tlb_addr, addr)) {
                    if (!victim_tlb_hit(env, mmu_idx, index, tlb_off,
                                        addr & TARGET_PAGE_MASK)) {
                        tlb_fill(env_cpu(env), addr, size,
                                 access_type, mmu_idx, retaddr);
                        index = tlb_index(env, mmu_idx, addr);
                        entry = tlb_entry(env, mmu_idx, addr);
                    }
                    tlb_addr = code_read ? entry->addr_code : entry->addr_read;
                    tlb_addr &= ~TLB_INVALID_MASK;
                }
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_READ_PROT;
                // printf("***** Invalid memory read (non-readable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    } else {
        // code fetching
        // Unicorn: callback on fetch from NX
        if (mr != NULL && !(mr->perms & UC_PROT_EXEC)) {  // non-executable
            handled = false;
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_FETCH_PROT) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                if ((handled = ((uc_cb_eventmem_t)hook->callback)(uc, UC_MEM_FETCH_PROT, paddr, size, 0, hook->user_data)))
                    break;

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }

            if (handled) {
                uc->invalid_error = UC_ERR_OK;
            } else {
                uc->invalid_addr = paddr;
                uc->invalid_error = UC_ERR_FETCH_PROT;
                // printf("***** Invalid fetch (non-executable) at " TARGET_FMT_lx "\n", addr);
                if (uc->nested_level > 0 && !uc->cpu->stopped) {
                    cpu_exit(uc->cpu);
                    // See comments above
                    cpu_loop_exit(uc->cpu);
                }
                return 0;
            }
        }
    }

    /* Handle anything that isn't just a straight memory access.  */
    if (unlikely(tlb_addr & ~TARGET_PAGE_MASK)) {
        CPUIOTLBEntry *iotlbentry;
        bool need_swap;

        /* For anything that is unaligned, recurse through full_load.  */
        if ((addr & (size - 1)) != 0) {
            goto do_unaligned_access;
        }

        iotlbentry = &env_tlb(env)->d[mmu_idx].iotlb[index];

        /* Handle watchpoints.  */
        if (unlikely(tlb_addr & TLB_WATCHPOINT)) {
            /* On watchpoint hit, this will longjmp out.  */
            cpu_check_watchpoint(env_cpu(env), addr, size,
                                 iotlbentry->attrs, BP_MEM_READ, retaddr);
        }

        need_swap = size > 1 && (tlb_addr & TLB_BSWAP);

        /* Handle I/O access.  */
        if (likely(tlb_addr & TLB_MMIO)) {
            res = io_readx(env, iotlbentry, mmu_idx, addr, retaddr,
                            access_type, op ^ (need_swap * MO_BSWAP));
            goto _out;
        }

        haddr = (void *)((uintptr_t)addr + entry->addend);

        /*
         * Keep these two load_memop separate to ensure that the compiler
         * is able to fold the entire function to a single instruction.
         * There is a build-time assert inside to remind you of this.  ;-)
         */
        if (unlikely(need_swap)) {
            res = load_memop(haddr, op ^ MO_BSWAP);
            goto _out;
        }
        res = load_memop(haddr, op);
        goto _out;
    }

    /* Handle slow unaligned access (it spans two pages or IO).  */
    if (size > 1
        && unlikely((addr & ~TARGET_PAGE_MASK) + size - 1
                    >= TARGET_PAGE_SIZE)) {
        target_ulong addr1, addr2;
        uint64_t r1, r2;
        unsigned shift;
        int old_size;
    do_unaligned_access:
        addr1 = addr & ~((target_ulong)size - 1);
        addr2 = addr1 + size;
        old_size = uc->size_recur_mem;
        uc->size_recur_mem = size;
        r1 = full_load(env, addr1, oi, retaddr);
        r2 = full_load(env, addr2, oi, retaddr);
        uc->size_recur_mem = old_size;
        shift = (addr & (size - 1)) * 8;

        if (memop_big_endian(op)) {
            /* Big-endian combine.  */
            res = (r1 << shift) | (r2 >> ((size * 8) - shift));
        } else {
            /* Little-endian combine.  */
            res = (r1 >> shift) | (r2 << ((size * 8) - shift));
        }
        res = res & MAKE_64BIT_MASK(0, size * 8);
        goto _out;
    }

    haddr = (void *)((uintptr_t)addr + entry->addend);
    res = load_memop(haddr, op);

_out:
    // Unicorn: callback on successful data read
    if (!code_read) {
        if (!uc->size_recur_mem) { // disabling read callback if in recursive call
            HOOK_FOREACH(uc, hook, UC_HOOK_MEM_READ_AFTER) {
                if (hook->to_delete)
                    continue;
                if (!HOOK_BOUND_CHECK(hook, paddr))
                    continue;
                ((uc_cb_hookmem_t)hook->callback)(env->uc, UC_MEM_READ_AFTER, paddr, size, res, hook->user_data);

                // the last callback may already asked to stop emulation
                if (uc->stop_request)
                    break;
            }
        }
    }

    return res;
}